

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

ssize_t __thiscall
Json::StyledWriter::write_abi_cxx11_(StyledWriter *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  StyledWriter *this_00;
  Value *root_local;
  StyledWriter *this_local;
  
  this_00 = (StyledWriter *)CONCAT44(in_register_00000034,__fd);
  std::__cxx11::string::operator=((string *)&this_00->document_,"");
  this_00->addChildValues_ = false;
  std::__cxx11::string::operator=((string *)&this_00->indentString_,"");
  writeCommentBeforeValue(this_00,(Value *)__buf);
  writeValue(this_00,(Value *)__buf);
  writeCommentAfterValueOnSameLine(this_00,(Value *)__buf);
  std::__cxx11::string::operator+=((string *)&this_00->document_,"\n");
  std::__cxx11::string::string((string *)this,(string *)&this_00->document_);
  return (ssize_t)this;
}

Assistant:

std::string StyledWriter::write(const Value& root) {
  document_ = "";
  addChildValues_ = false;
  indentString_ = "";
  writeCommentBeforeValue(root);
  writeValue(root);
  writeCommentAfterValueOnSameLine(root);
  document_ += "\n";
  return document_;
}